

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::
class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>,___gnu_cxx::__normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>,_false,_(pybind11::return_value_policy)6>_>
::class_<pybind11::module_local>
          (class_<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>,___gnu_cxx::__normal_iterator<PerfectMatch_*,_std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>_>,_false,_(pybind11::return_value_policy)6>_>
           *this,handle scope,char *name,module_local *extra)

{
  process_attributes<pybind11::module_local> *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  type_record *in_RDI;
  type_record record;
  type_record *in_stack_00000188;
  generic_type *in_stack_00000190;
  undefined8 local_88;
  undefined8 local_80;
  pointer_____offset_0x10___ *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  code *local_50;
  code *local_48;
  byte local_28;
  process_attributes<pybind11::module_local> *local_20;
  undefined8 local_18;
  undefined8 local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RSI;
  pybind11::detail::generic_type::generic_type((generic_type *)in_RDI);
  pybind11::detail::type_record::type_record(in_RDI);
  local_88 = local_8;
  local_80 = local_18;
  local_78 = &pybind11::detail::
              iterator_state<__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,false,(pybind11::return_value_policy)6>
              ::typeinfo;
  local_70 = 0x18;
  local_68 = 8;
  local_60 = 8;
  local_50 = init_instance;
  local_48 = dealloc;
  local_28 = local_28 | 8;
  pybind11::detail::
  set_operator_new<pybind11::detail::iterator_state<__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,__gnu_cxx::__normal_iterator<PerfectMatch*,std::vector<PerfectMatch,std::allocator<PerfectMatch>>>,false,(pybind11::return_value_policy)6>>
            (&local_88);
  pybind11::detail::process_attributes<pybind11::module_local>::init
            (local_20,(EVP_PKEY_CTX *)&local_88);
  pybind11::detail::generic_type::initialize(in_stack_00000190,in_stack_00000188);
  pybind11::detail::type_record::~type_record((type_record *)0x31e050);
  return;
}

Assistant:

class_(handle scope, const char *name, const Extra &... extra) {
        using namespace detail;

        // MI can only be specified via class_ template options, not constructor parameters
        static_assert(
            none_of<is_pyobject<Extra>...>::value || // no base class arguments, or:
            (   constexpr_sum(is_pyobject<Extra>::value...) == 1 && // Exactly one base
                constexpr_sum(is_base<options>::value...)   == 0 && // no template option bases
                none_of<std::is_same<multiple_inheritance, Extra>...>::value), // no multiple_inheritance attr
            "Error: multiple inheritance bases must be specified via class_ template options");

        type_record record;
        record.scope = scope;
        record.name = name;
        record.type = &typeid(type);
        record.type_size = sizeof(conditional_t<has_alias, type_alias, type>);
        record.type_align = alignof(conditional_t<has_alias, type_alias, type>&);
        record.holder_size = sizeof(holder_type);
        record.init_instance = init_instance;
        record.dealloc = dealloc;
        record.default_holder = detail::is_instantiation<std::unique_ptr, holder_type>::value;

        set_operator_new<type>(&record);

        /* Register base classes specified via template arguments to class_, if any */
        PYBIND11_EXPAND_SIDE_EFFECTS(add_base<options>(record));

        /* Process optional arguments, if any */
        process_attributes<Extra...>::init(extra..., &record);

        generic_type::initialize(record);

        if (has_alias) {
            auto &instances = record.module_local ? registered_local_types_cpp() : get_internals().registered_types_cpp;
            instances[std::type_index(typeid(type_alias))] = instances[std::type_index(typeid(type))];
        }
    }